

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tf_decode_data.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::DecodeDataBuilder::AddFirst
          (DecodeDataBuilder *this,char desired,char input)

{
  uint8_t uVar1;
  
  if (desired == input) {
    uVar1 = '\0';
  }
  else {
    uVar1 = '@';
    if ((*(char *)((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)(byte)input) !=
         desired) &&
       (uVar1 = ' ',
       *(char *)((long)&absl::lts_20240722::ascii_internal::kToLower + (ulong)(byte)input) !=
       desired)) {
      return false;
    }
  }
  this->op_ = uVar1;
  AddChar(this,desired);
  return true;
}

Assistant:

bool AddFirst(const char desired, const char input) {
    if (desired == input) {
      op_ = kOpAsIs;
    } else if (desired == absl::ascii_toupper(input)) {
      op_ = kOpFirstUpper;
    } else if (desired == absl::ascii_tolower(input)) {
      op_ = kOpFirstLower;
    } else {
      // Can't be transformed to match.
      return false;
    }
    AddChar(desired);
    return true;
  }